

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TElasticity2DAnalytic::TElasticity2DAnalytic(TElasticity2DAnalytic *this,TElasticity2DAnalytic *cp)

{
  (this->super_TPZAnalyticSolution)._vptr_TPZAnalyticSolution =
       (_func_int **)&PTR__TPZAnalyticSolution_01a08a80;
  (this->super_TPZAnalyticSolution).fSignConvention =
       (cp->super_TPZAnalyticSolution).fSignConvention;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "TPZAnalyticSolution::TPZAnalyticSolution(const TPZAnalyticSolution &cp): One should not invoke this copy constructor"
             ,0x74);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
             ,0xa6);
}

Assistant:

TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp) : TPZAnalyticSolution(cp),fProblemType(cp.fProblemType) {
    std::cout << "TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp): One should not invoke this copy constructor";
    DebugStop();
}